

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void extent_dalloc_wrapper
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  extent_dalloc_t *peVar1;
  code *pcVar2;
  bool bVar3;
  _Bool _Var4;
  char cVar5;
  extent_hooks_t *peVar6;
  undefined1 in_R9B;
  ulong uVar7;
  ulong uVar8;
  
  if ((*r_extent_hooks != &extent_hooks_default) || (!opt_retain)) {
    extent_deregister(tsdn,extent);
    *(ushort *)&extent->e_addr = *(ushort *)&extent->e_addr & 0xf000;
    extent_hooks_assure_initialized(arena,r_extent_hooks);
    if (*r_extent_hooks == &extent_hooks_default) {
      bVar3 = extent_dalloc_default_impl
                        ((void *)((ulong)extent->e_addr & 0xfffffffffffff000),
                         (extent->field_2).e_size_esn & 0xfffffffffffff000);
joined_r0x00123b21:
      if (!bVar3) {
        extent_dalloc(tsdn,arena,extent);
        return;
      }
    }
    else {
      extent_hook_pre_reentrancy(tsdn,arena);
      peVar1 = (*r_extent_hooks)->dalloc;
      if (peVar1 != (extent_dalloc_t *)0x0) {
        bVar3 = (*peVar1)(*r_extent_hooks,(void *)((ulong)extent->e_addr & 0xfffffffffffff000),
                          (extent->field_2).e_size_esn & 0xfffffffffffff000,
                          (_Bool)((byte)((uint)extent->e_bits >> 0xd) & 1),arena->base->ind);
        extent_hook_post_reentrancy(tsdn);
        goto joined_r0x00123b21;
      }
      extent_hook_post_reentrancy(tsdn);
    }
    extent_register(tsdn,extent);
    if (*r_extent_hooks != &extent_hooks_default) {
      extent_hook_pre_reentrancy(tsdn,arena);
    }
  }
  uVar8 = 0x8000;
  if ((extent->e_bits & 0x2000) != 0) {
    uVar7 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
    _Var4 = extent_decommit_wrapper(tsdn,arena,r_extent_hooks,extent,0,uVar7);
    in_R9B = (undefined1)uVar7;
    if (_Var4) {
      pcVar2 = (code *)(*r_extent_hooks)->purge_forced;
      if (pcVar2 != (code *)0x0) {
        uVar7 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
        in_R9B = (undefined1)arena->base->ind;
        cVar5 = (*pcVar2)(*r_extent_hooks,(ulong)extent->e_addr & 0xfffffffffffff000,uVar7,0,uVar7);
        if (cVar5 == '\0') goto LAB_00123c14;
      }
      if ((extent->e_bits & 0x30000) == 0x20000) {
        uVar8 = 0;
      }
      else {
        peVar6 = *r_extent_hooks;
        if ((code *)peVar6->purge_lazy == (code *)0x0) {
          uVar8 = 0;
          goto LAB_00123c17;
        }
        uVar7 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
        in_R9B = (undefined1)arena->base->ind;
        uVar8 = 0;
        (*(code *)peVar6->purge_lazy)
                  (peVar6,(ulong)extent->e_addr & 0xfffffffffffff000,uVar7,0,uVar7);
      }
    }
  }
LAB_00123c14:
  peVar6 = *r_extent_hooks;
LAB_00123c17:
  if (peVar6 != &extent_hooks_default) {
    extent_hook_post_reentrancy(tsdn);
  }
  extent->e_bits = extent->e_bits & 0xffffffffffff7fff | uVar8;
  extent_record(tsdn,arena,r_extent_hooks,&arena->extents_retained,extent,(_Bool)in_R9B);
  return;
}

Assistant:

void
extent_dalloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	assert(extent_dumpable_get(extent));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Avoid calling the default extent_dalloc unless have to. */
	if (*r_extent_hooks != &extent_hooks_default || extent_may_dalloc()) {
		/*
		 * Deregister first to avoid a race with other allocating
		 * threads, and reregister if deallocation fails.
		 */
		extent_deregister(tsdn, extent);
		if (!extent_dalloc_wrapper_try(tsdn, arena, r_extent_hooks,
		    extent)) {
			return;
		}
		extent_reregister(tsdn, extent);
	}

	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	/* Try to decommit; purge if that fails. */
	bool zeroed;
	if (!extent_committed_get(extent)) {
		zeroed = true;
	} else if (!extent_decommit_wrapper(tsdn, arena, r_extent_hooks, extent,
	    0, extent_size_get(extent))) {
		zeroed = true;
	} else if ((*r_extent_hooks)->purge_forced != NULL &&
	    !(*r_extent_hooks)->purge_forced(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena))) {
		zeroed = true;
	} else if (extent_state_get(extent) == extent_state_muzzy ||
	    ((*r_extent_hooks)->purge_lazy != NULL &&
	    !(*r_extent_hooks)->purge_lazy(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena)))) {
		zeroed = false;
	} else {
		zeroed = false;
	}
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_zeroed_set(extent, zeroed);

	if (config_prof) {
		extent_gdump_sub(tsdn, extent);
	}

	extent_record(tsdn, arena, r_extent_hooks, &arena->extents_retained,
	    extent, false);
}